

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCxxModuleMapper.cxx
# Opt level: O0

string * __thiscall
(anonymous_namespace)::CxxModuleMapContentMsvc_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,CxxModuleLocations *loc,
          cmScanDepInfo *obj,CxxModuleUsage *usages)

{
  bool bVar1;
  size_type sVar2;
  _Rb_tree_header *this_00;
  _Base_ptr *this_01;
  reference pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer ppVar5;
  iterator __first;
  iterator __last;
  size_type sVar6;
  pointer ppVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  ostream *poVar9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  static_string_view flag_1;
  _Self local_330;
  const_iterator module_ref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *transitive_name;
  iterator __end1_2;
  iterator __begin1_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  _Self local_2f8;
  _Self local_2f0;
  const_iterator transitive_usages;
  static_string_view flag;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bmi_loc_1;
  cmSourceReqInfo *r;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transitive_usage_names;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transitive_usage_directs;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> bmi_loc
  ;
  cmSourceReqInfo *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range1;
  stringstream local_1b0 [3];
  anon_class_1_0_00000001 flag_for_method;
  stringstream mm;
  ostream local_1a0;
  cmScanDepInfo *local_28;
  CxxModuleUsage *usages_local;
  cmScanDepInfo *obj_local;
  CxxModuleLocations *loc_local;
  
  local_28 = obj;
  usages_local = (CxxModuleUsage *)loc;
  obj_local = (cmScanDepInfo *)this;
  loc_local = (CxxModuleLocations *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  sVar2 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::size
                    ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)
                     &(usages_local->Reference)._M_t._M_impl.super__Rb_tree_header);
  if (sVar2 < 2) {
    this_00 = &(usages_local->Reference)._M_t._M_impl.super__Rb_tree_header;
    __end1 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::begin
                       ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)this_00);
    p = (cmSourceReqInfo *)
        std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::end
                  ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                                       *)&p), bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
               ::operator*(&__end1);
      if ((pcVar3->IsInterface & 1U) == 0) {
        std::operator<<(&local_1a0,"-internalPartition\n");
      }
      else {
        std::operator<<(&local_1a0,"-interface\n");
      }
      CxxModuleLocations::BmiGeneratorPathForModule
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&transitive_usage_directs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (CxxModuleLocations *)obj_local,&pcVar3->LogicalName);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &transitive_usage_directs._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      if (bVar1) {
        poVar9 = std::operator<<(&local_1a0,"-ifcOutput ");
        pbVar4 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&transitive_usage_directs._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
        poVar9 = std::operator<<(poVar9,(string *)pbVar4);
        std::operator<<(poVar9,'\n');
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&transitive_usage_directs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __gnu_cxx::
      __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
      ::operator++(&__end1);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&transitive_usage_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range1_1);
    this_01 = &(usages_local->Reference)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    __end1_1 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::begin
                         ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)this_01);
    r = (cmSourceReqInfo *)
        std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::end
                  ((vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                               *)&r), bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
               ::operator*(&__end1_1);
      CxxModuleLocations::BmiGeneratorPathForModule
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&flag.super_string_view._M_str,(CxxModuleLocations *)obj_local,
                 &pcVar3->LogicalName);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&flag.super_string_view._M_str);
      if (bVar1) {
        bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
                 anon_unknown.dwarf_d5b196::CxxModuleMapContentMsvc::anon_class_1_0_00000001::
                 operator()((anon_class_1_0_00000001 *)((long)&__range1 + 3),pcVar3->Method);
        flag.super_string_view._M_len = (size_t)bVar11._M_str;
        pbVar8 = std::operator<<(&local_1a0,bVar11);
        poVar9 = std::operator<<(pbVar8,' ');
        poVar9 = std::operator<<(poVar9,(string *)pcVar3);
        poVar9 = std::operator<<(poVar9,'=');
        pbVar4 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&flag.super_string_view._M_str);
        poVar9 = std::operator<<(poVar9,(string *)pbVar4);
        std::operator<<(poVar9,"\n");
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&transitive_usage_names._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,&pcVar3->LogicalName);
        transitive_usages._M_node = (_Base_ptr)pVar10.first._M_node;
        local_2f0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)local_28,&pcVar3->LogicalName);
        local_2f8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)local_28);
        bVar1 = std::operator!=(&local_2f0,&local_2f8);
        if (bVar1) {
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator->(&local_2f0);
          __first = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin(&ppVar5->second);
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator->(&local_2f0);
          __last = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&ppVar5->second);
          std::
          set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                    ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&__range1_1,
                     (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )__first._M_node,
                     (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )__last._M_node);
        }
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&flag.super_string_view._M_str);
      __gnu_cxx::
      __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
      ::operator++(&__end1_1);
    }
    __end1_2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range1_1);
    transitive_name =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1_1);
    while (bVar1 = std::operator!=(&__end1_2,(_Self *)&transitive_name), bVar1) {
      module_ref._M_node =
           (_Base_ptr)
           std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end1_2);
      sVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&transitive_usage_names._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (key_type *)module_ref._M_node);
      if (sVar6 == 0) {
        local_330._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                     *)&(local_28->ExtraOutputs).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,module_ref._M_node);
        flag_1.super_string_view._M_str =
             (char *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                            *)&(local_28->ExtraOutputs).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = std::operator!=(&local_330,(_Self *)&flag_1.super_string_view._M_str);
        if (bVar1) {
          ppVar7 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>
                   ::operator->(&local_330);
          bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
                   anon_unknown.dwarf_d5b196::CxxModuleMapContentMsvc::anon_class_1_0_00000001::
                   operator()((anon_class_1_0_00000001 *)((long)&__range1 + 3),
                              (ppVar7->second).Method);
          flag_1.super_string_view._M_len = (size_t)bVar11._M_str;
          pbVar8 = std::operator<<(&local_1a0,bVar11);
          poVar9 = std::operator<<(pbVar8,' ');
          poVar9 = std::operator<<(poVar9,(string *)module_ref._M_node);
          poVar9 = std::operator<<(poVar9,'=');
          ppVar7 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>
                   ::operator->(&local_330);
          poVar9 = std::operator<<(poVar9,(string *)&ppVar7->second);
          std::operator<<(poVar9,"\n");
        }
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1_2);
    }
    std::__cxx11::stringstream::str();
    __range1._4_4_ = 1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1_1);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&transitive_usage_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    __range1._4_4_ = 1;
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string CxxModuleMapContentMsvc(CxxModuleLocations const& loc,
                                    cmScanDepInfo const& obj,
                                    CxxModuleUsage const& usages)
{
  std::stringstream mm;

  // A response file of `-reference NAME=PATH` arguments.

  // MSVC's command line only supports a single output. If more than one is
  // expected, we cannot make a useful module map file.
  if (obj.Provides.size() > 1) {
    return {};
  }

  auto flag_for_method = [](LookupMethod method) -> cm::static_string_view {
    switch (method) {
      case LookupMethod::ByName:
        return "-reference"_s;
      case LookupMethod::IncludeAngle:
        return "-headerUnit:angle"_s;
      case LookupMethod::IncludeQuote:
        return "-headerUnit:quote"_s;
    }
    assert(false && "unsupported lookup method");
    return ""_s;
  };

  for (auto const& p : obj.Provides) {
    if (p.IsInterface) {
      mm << "-interface\n";
    } else {
      mm << "-internalPartition\n";
    }

    if (auto bmi_loc = loc.BmiGeneratorPathForModule(p.LogicalName)) {
      mm << "-ifcOutput " << *bmi_loc << '\n';
    }
  }

  std::set<std::string> transitive_usage_directs;
  std::set<std::string> transitive_usage_names;

  for (auto const& r : obj.Requires) {
    if (auto bmi_loc = loc.BmiGeneratorPathForModule(r.LogicalName)) {
      auto flag = flag_for_method(r.Method);

      mm << flag << ' ' << r.LogicalName << '=' << *bmi_loc << "\n";
      transitive_usage_directs.insert(r.LogicalName);

      // Insert transitive usages.
      auto transitive_usages = usages.Usage.find(r.LogicalName);
      if (transitive_usages != usages.Usage.end()) {
        transitive_usage_names.insert(transitive_usages->second.begin(),
                                      transitive_usages->second.end());
      }
    }
  }

  for (auto const& transitive_name : transitive_usage_names) {
    if (transitive_usage_directs.count(transitive_name)) {
      continue;
    }

    auto module_ref = usages.Reference.find(transitive_name);
    if (module_ref != usages.Reference.end()) {
      auto flag = flag_for_method(module_ref->second.Method);
      mm << flag << ' ' << transitive_name << '=' << module_ref->second.Path
         << "\n";
    }
  }

  return mm.str();
}